

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  pointer pcVar1;
  pointer pbVar2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  string *psVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  cmAlphaNum *pcVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar8;
  char *pcVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fname;
  string fext;
  string shell;
  cmGeneratedFileStream f;
  cmCustomCommandGenerator ccg;
  undefined4 in_stack_fffffffffffffa10;
  int val;
  cmGhsMultiTargetGenerator *pcVar10;
  pointer cc;
  string local_5d8;
  long *local_5b8 [2];
  long local_5a8 [2];
  string local_598;
  long *local_578;
  long local_570;
  long local_568 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_558;
  bool local_538;
  long *local_530 [2];
  long local_520 [2];
  string *local_510;
  pointer local_508;
  string *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  code *local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined1 *local_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined1 *local_490;
  undefined1 local_488 [32];
  undefined8 local_468;
  undefined8 local_460;
  undefined1 *local_458;
  undefined1 local_450 [32];
  undefined1 local_430 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  undefined8 local_418;
  undefined1 *local_410;
  undefined8 local_408;
  undefined8 local_400;
  long *local_3f8;
  long **local_3f0;
  undefined8 local_3e8;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  size_type local_3d0;
  pointer local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined1 *local_3b0;
  undefined8 local_3a8;
  size_type local_3a0;
  pointer local_398;
  undefined8 local_390;
  size_t local_388;
  string *local_380;
  cmAlphaNum *local_378;
  undefined8 local_370;
  long *local_368;
  undefined8 local_360;
  undefined1 local_1c8 [56];
  cmCustomCommandGenerator local_190;
  
  local_5b8[0] = local_5a8;
  local_510 = cmd;
  local_500 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,".sh","");
  local_578 = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"/bin/sh ","");
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_508 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (cc != local_508) {
    val = 0;
    do {
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      pcVar1 = (this->ConfigName)._M_dataplus._M_p;
      pcVar10 = this;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,pcVar1,pcVar1 + (this->ConfigName)._M_string_length);
      local_538 = false;
      local_4f8 = 0;
      uStack_4f0 = 0;
      local_4e8 = (code *)0x0;
      uStack_4e0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_4_ = in_stack_fffffffffffffa10;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_4f8;
      computeInternalDepfile.super__Function_base._M_functor._12_4_ = val;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)pcVar10;
      computeInternalDepfile._M_invoker = (_Invoker_type)cc;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_190,cc,&local_598,&this->LocalGenerator->super_cmLocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_558,computeInternalDepfile);
      if (local_4e8 != (code *)0x0) {
        (*local_4e8)(&local_4f8,&local_4f8,3);
      }
      if (local_538 == true) {
        local_538 = false;
        if (local_558._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_558._M_value + 0x10))
        {
          operator_delete((void *)local_558._M_value._M_dataplus._M_p,local_558._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      this = pcVar10;
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         (&pcVar10->LocalGenerator->super_cmLocalGenerator);
      (*(pcVar10->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
        _vptr_cmOutputConverter[0x10])(local_530,pcVar10->LocalGenerator,pcVar10->GeneratorTarget);
      local_430._8_8_ = (psVar3->_M_dataplus)._M_p;
      local_430._0_8_ = psVar3->_M_string_length;
      local_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_468 = 0;
      local_460 = 1;
      local_458 = local_450;
      local_450[0] = 0x2f;
      local_418 = 1;
      local_408 = 0;
      local_400 = local_530[1];
      local_3f8 = local_530[0];
      local_4a0 = 0;
      local_498 = 1;
      local_490 = local_488;
      local_488[0] = 0x2f;
      local_3e8 = 1;
      local_3d8 = 0;
      local_3c8 = (pcVar10->Name)._M_dataplus._M_p;
      local_3d0 = (pcVar10->Name)._M_string_length;
      local_3c0 = 0;
      local_4d8 = 0;
      local_4d0 = 1;
      local_4c8 = local_4c0;
      local_4c0[0] = 0x5f;
      local_3b8 = 1;
      local_3a8 = 0;
      local_398 = (local_500->_M_dataplus)._M_p;
      local_3a0 = local_500->_M_string_length;
      local_390 = 0;
      local_410 = local_458;
      local_3f0 = local_530;
      local_3e0 = local_490;
      local_3b0 = local_4c8;
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_1c8,val);
      pcVar6 = (cmAlphaNum *)local_1c8._0_8_;
      if ((cmAlphaNum *)local_1c8._0_8_ == (cmAlphaNum *)0x0) {
        pcVar6 = (cmAlphaNum *)(local_1c8 + 0x10);
      }
      local_380 = pcVar6->RValueString_;
      pcVar6 = (cmAlphaNum *)local_1c8._0_8_;
      if ((cmAlphaNum *)local_1c8._0_8_ == (cmAlphaNum *)0x0) {
        pcVar6 = (cmAlphaNum *)local_1c8;
      }
      local_388 = (pcVar6->View_)._M_len;
      local_378 = (cmAlphaNum *)local_1c8._0_8_;
      local_370 = local_5b8[1];
      local_368 = local_5b8[0];
      local_360 = 0;
      views._M_len = 9;
      views._M_array = (iterator)local_430;
      cmCatViews(&local_5d8,views);
      if (local_530[0] != local_520) {
        operator_delete(local_530[0],local_520[0] + 1);
      }
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_430,&local_5d8,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_430,true);
      WriteCustomCommandsHelper(this,(ostream *)local_430,&local_190);
      cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_430);
      if (this->TagType == CUSTOM_TARGET) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    :outputName=\"",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
        lVar7 = 7;
        pcVar9 = ".rule\"\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    :",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(local_510->_M_dataplus)._M_p,local_510->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=\"",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_578,local_570);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
        lVar7 = 2;
        pcVar9 = "\"\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar7);
      pvVar5 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&local_190);
      pbVar2 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (pvVar5->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
          pbVar8 = pbVar8 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    :extraOutputFile=\"",0x16);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      val = val + 1;
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_190);
      cc = cc + 1;
    } while (cc != local_508);
  }
  if (local_578 != local_568) {
    operator_delete(local_578,local_568[0] + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;
#ifdef _WIN32
  std::string fext = ".bat";
  std::string shell;
#else
  std::string fext = ".sh";
  std::string shell = "/bin/sh ";
#endif

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname =
      cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               '/', this->Name, '_', name, cmdcount++, fext);

    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << shell << fname << "\"\n";
    } else {
      fout << fname << "\n    :outputName=\"" << fname << ".rule\"\n";
    }
    for (const auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"\n";
    }
  }
}